

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void sparc_tcg_init_sparc(uc_struct_conflict8 *uc)

{
  long offset;
  TCGContext_conflict7 *s;
  TCGTemp *pTVar1;
  long lVar2;
  char (*name) [4];
  
  s = uc->tcg_ctx;
  sparc_tcg_init_sparc::r32[0].ptr = &s->cpu_cc_op;
  sparc_tcg_init_sparc::r32[1].ptr = &s->cpu_psr;
  sparc_tcg_init_sparc::r32[2].ptr = &s->cpu_wim;
  sparc_tcg_init_sparc::rtl[0].ptr = &s->cpu_cond;
  sparc_tcg_init_sparc::rtl[1].ptr = &s->cpu_cc_src;
  sparc_tcg_init_sparc::rtl[2].ptr = &s->cpu_cc_src2;
  sparc_tcg_init_sparc::rtl[3].ptr = &s->cpu_cc_dst;
  sparc_tcg_init_sparc::rtl[4].ptr = &s->cpu_fsr;
  sparc_tcg_init_sparc::rtl[5].ptr = &s->cpu_pc;
  sparc_tcg_init_sparc::rtl[6].ptr = &s->cpu_npc;
  sparc_tcg_init_sparc::rtl[7].ptr = &s->cpu_y;
  sparc_tcg_init_sparc::rtl[8].ptr = &s->cpu_tbr;
  pTVar1 = tcg_global_mem_new_internal_sparc(s,TCG_TYPE_I64,s->cpu_env,0x20,"regwptr");
  s->cpu_regwptr = (TCGv_ptr)((long)pTVar1 - (long)s);
  lVar2 = 0x10;
  do {
    pTVar1 = tcg_global_mem_new_internal_sparc
                       (s,TCG_TYPE_I32,s->cpu_env,(long)*(int *)((long)ieee_rm_mips64el + lVar2 + 8)
                        ,*(char **)((long)&sparc_tcg_init_sparc::r32[0].ptr + lVar2));
    **(long **)((long)ieee_rm_mips64el + lVar2) = (long)pTVar1 - (long)s;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x58);
  lVar2 = 0x10;
  do {
    pTVar1 = tcg_global_mem_new_internal_sparc
                       (s,TCG_TYPE_I32,s->cpu_env,(long)*(int *)(lVar2 + 0x1120e88),
                        *(char **)((long)&sparc_tcg_init_sparc::rtl[0].ptr + lVar2));
    **(long **)((long)&sparc_tcg_init_sparc::r32[2].name + lVar2) = (long)pTVar1 - (long)s;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xe8);
  s->cpu_regs[0] = (TCGv_i32)0x0;
  lVar2 = 0;
  do {
    offset = lVar2 + 4;
    pTVar1 = tcg_global_mem_new_internal_sparc
                       (s,TCG_TYPE_I32,s->cpu_env,offset,sparc_tcg_init_sparc::gregnames[1] + lVar2)
    ;
    *(long *)((long)s->cpu_regs + lVar2 * 2 + 8) = (long)pTVar1 - (long)s;
    lVar2 = offset;
  } while (offset != 0x1c);
  lVar2 = 0;
  do {
    pTVar1 = tcg_global_mem_new_internal_sparc
                       (s,TCG_TYPE_I32,s->cpu_regwptr,lVar2,
                        sparc_tcg_init_sparc::gregnames[8] + lVar2);
    *(long *)((long)s->cpu_regs + lVar2 * 2 + 0x40) = (long)pTVar1 - (long)s;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x60);
  name = sparc_tcg_init_sparc::fregnames;
  lVar2 = 0x8cd8;
  do {
    pTVar1 = tcg_global_mem_new_internal_sparc(s,TCG_TYPE_I64,s->cpu_env,lVar2 + -0x8c88,*name);
    *(long *)((long)&s->pool_cur + lVar2) = (long)pTVar1 - (long)s;
    name = name + 1;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x8d58);
  return;
}

Assistant:

void sparc_tcg_init(struct uc_struct *uc)
{
    TCGContext *tcg_ctx = uc->tcg_ctx;

    static const char gregnames[32][4] = {
        "g0", "g1", "g2", "g3", "g4", "g5", "g6", "g7",
        "o0", "o1", "o2", "o3", "o4", "o5", "o6", "o7",
        "l0", "l1", "l2", "l3", "l4", "l5", "l6", "l7",
        "i0", "i1", "i2", "i3", "i4", "i5", "i6", "i7",
    };
    static const char fregnames[32][4] = {
        "f0", "f2", "f4", "f6", "f8", "f10", "f12", "f14",
        "f16", "f18", "f20", "f22", "f24", "f26", "f28", "f30",
        "f32", "f34", "f36", "f38", "f40", "f42", "f44", "f46",
        "f48", "f50", "f52", "f54", "f56", "f58", "f60", "f62",
    };

    static struct { TCGv_i32 *ptr; int off; const char *name; } r32[] = {
        { NULL /* &tcg_ctx->cpu_cc_op */, offsetof(CPUSPARCState, cc_op), "cc_op" },
        { NULL /* &tcg_ctx->cpu_psr */, offsetof(CPUSPARCState, psr), "psr" },
#ifdef TARGET_SPARC64
        { NULL /* &tcg_ctx->cpu_xcc */, offsetof(CPUSPARCState, xcc), "xcc" },
        { NULL /* &tcg_ctx->cpu_fprs */, offsetof(CPUSPARCState, fprs), "fprs" },
#else
        { NULL /* &tcg_ctx->cpu_wim */, offsetof(CPUSPARCState, wim), "wim" },
#endif
    };

    static struct { TCGv *ptr; int off; const char *name; } rtl[] = {
        { NULL /* &tcg_ctx->cpu_cond */, offsetof(CPUSPARCState, cond), "cond" },
        { NULL /* &tcg_ctx->cpu_cc_src */, offsetof(CPUSPARCState, cc_src), "cc_src" },
        { NULL /* &tcg_ctx->cpu_cc_src2 */, offsetof(CPUSPARCState, cc_src2), "cc_src2" },
        { NULL /* &tcg_ctx->cpu_cc_dst */, offsetof(CPUSPARCState, cc_dst), "cc_dst" },
        { NULL /* &tcg_ctx->cpu_fsr */, offsetof(CPUSPARCState, fsr), "fsr" },
        { NULL /* &tcg_ctx->cpu_pc */, offsetof(CPUSPARCState, pc), "pc" },
        { NULL /* &tcg_ctx->cpu_npc */, offsetof(CPUSPARCState, npc), "npc" },
        { NULL /* &tcg_ctx->cpu_y */, offsetof(CPUSPARCState, y), "y" },
        { NULL /* &tcg_ctx->cpu_tbr */, offsetof(CPUSPARCState, tbr), "tbr" },
#ifdef TARGET_SPARC64
        { NULL /* &tcg_ctx->cpu_gsr */, offsetof(CPUSPARCState, gsr), "gsr" },
        { NULL /* &tcg_ctx->cpu_tick_cmpr */, offsetof(CPUSPARCState, tick_cmpr), "tick_cmpr" },
        { NULL /* &tcg_ctx->cpu_stick_cmpr */, offsetof(CPUSPARCState, stick_cmpr), "stick_cmpr" },
        { NULL /* &tcg_ctx->cpu_hstick_cmpr */, offsetof(CPUSPARCState, hstick_cmpr), "hstick_cmpr" },
        { NULL /* &tcg_ctx->cpu_hintp */, offsetof(CPUSPARCState, hintp), "hintp" },
        { NULL /* &tcg_ctx->cpu_htba */, offsetof(CPUSPARCState, htba), "htba" },
        { NULL /* &tcg_ctx->cpu_hver */, offsetof(CPUSPARCState, hver), "hver" },
        { NULL /* &tcg_ctx->cpu_ssr */, offsetof(CPUSPARCState, ssr), "ssr" },
        { NULL /* &tcg_ctx->cpu_ver */, offsetof(CPUSPARCState, version), "ver" },
#endif
    };
    unsigned int i;

    r32[0].ptr = &tcg_ctx->cpu_cc_op;
    r32[1].ptr = &tcg_ctx->cpu_psr;
#ifdef TARGET_SPARC64
    r32[2].ptr = &tcg_ctx->cpu_xcc;
    r32[3].ptr = &tcg_ctx->cpu_fprs;
#else
    r32[2].ptr = &tcg_ctx->cpu_wim;
#endif

    rtl[0].ptr = &tcg_ctx->cpu_cond;
    rtl[1].ptr = &tcg_ctx->cpu_cc_src;
    rtl[2].ptr = &tcg_ctx->cpu_cc_src2;
    rtl[3].ptr = &tcg_ctx->cpu_cc_dst;
    rtl[4].ptr = &tcg_ctx->cpu_fsr;
    rtl[5].ptr = &tcg_ctx->cpu_pc;
    rtl[6].ptr = &tcg_ctx->cpu_npc;
    rtl[7].ptr = &tcg_ctx->cpu_y;
    rtl[8].ptr = &tcg_ctx->cpu_tbr;
#ifdef TARGET_SPARC64
    rtl[9].ptr = &tcg_ctx->cpu_gsr;
    rtl[10].ptr = &tcg_ctx->cpu_tick_cmpr;
    rtl[11].ptr = &tcg_ctx->cpu_stick_cmpr;
    rtl[12].ptr = &tcg_ctx->cpu_hstick_cmpr;
    rtl[13].ptr = &tcg_ctx->cpu_hintp;
    rtl[14].ptr = &tcg_ctx->cpu_htba;
    rtl[15].ptr = &tcg_ctx->cpu_hver;
    rtl[16].ptr = &tcg_ctx->cpu_ssr;
    rtl[17].ptr = &tcg_ctx->cpu_ver;
#endif

    tcg_ctx->cpu_regwptr = tcg_global_mem_new_ptr(tcg_ctx, tcg_ctx->cpu_env,
                                         offsetof(CPUSPARCState, regwptr),
                                         "regwptr");

    for (i = 0; i < ARRAY_SIZE(r32); ++i) {
        *r32[i].ptr = tcg_global_mem_new_i32(tcg_ctx, tcg_ctx->cpu_env, r32[i].off, r32[i].name);
    }

    for (i = 0; i < ARRAY_SIZE(rtl); ++i) {
        *rtl[i].ptr = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, rtl[i].off, rtl[i].name);
    }

    tcg_ctx->cpu_regs[0] = NULL;
    for (i = 1; i < 8; ++i) {
        tcg_ctx->cpu_regs[i] = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env,
                                         offsetof(CPUSPARCState, gregs[i]),
                                         gregnames[i]);
    }

    for (i = 8; i < 32; ++i) {
        tcg_ctx->cpu_regs[i] = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_regwptr,
                                         (i - 8) * sizeof(target_ulong),
                                         gregnames[i]);
    }

    for (i = 0; i < TARGET_DPREGS; i++) {
        tcg_ctx->cpu_fpr[i] = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
                                            offsetof(CPUSPARCState, fpr[i]),
                                            fregnames[i]);
    }
}